

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

int __thiscall Catch::Session::runInternal(Session *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  Context *this_00;
  Config *pCVar5;
  undefined4 extraout_var;
  IEventListener *pIVar6;
  uint64_t uVar7;
  int *piVar8;
  long in_RDI;
  exception *ex;
  Totals totals;
  TestGroup tests;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *spec;
  const_iterator __end3;
  const_iterator __begin3;
  vectorStrings *__range3;
  vectorStrings *invalidSpecs;
  IEventListenerPtr reporter;
  Config *in_stack_fffffffffffffc68;
  TestGroup *in_stack_fffffffffffffc70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc80;
  TestGroup *in_stack_fffffffffffffd20;
  int local_2d4 [3];
  int local_2c8;
  Counts local_2b0 [2];
  Config *in_stack_fffffffffffffda0;
  IEventListenerPtr *in_stack_fffffffffffffda8;
  TestGroup *in_stack_fffffffffffffdb0;
  Config *in_stack_fffffffffffffe38;
  undefined8 local_60;
  undefined8 local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  vectorStrings *local_38;
  vectorStrings *local_30;
  unique_ptr<Catch::IEventListener> local_28 [4];
  int local_4;
  
  if ((*(byte *)(in_RDI + 0x178) & 1) != 0) {
    return 1;
  }
  if (((*(byte *)(in_RDI + 0x67) & 1) != 0) || ((*(byte *)(in_RDI + 0x6a) & 1) != 0)) {
    return 0;
  }
  if (*(uint *)(in_RDI + 0x74) <= *(uint *)(in_RDI + 0x78)) {
    poVar4 = cerr();
    poVar4 = std::operator<<(poVar4,"The shard count (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(uint *)(in_RDI + 0x74));
    poVar4 = std::operator<<(poVar4,") must be greater than the shard index (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(uint *)(in_RDI + 0x78));
    poVar4 = std::operator<<(poVar4,")\n");
    std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
    return 1;
  }
  config((Session *)in_stack_fffffffffffffc70);
  Detail::unique_ptr<Catch::Config>::operator*((unique_ptr<Catch::Config> *)(in_RDI + 0x170));
  seedRng((IConfig *)in_stack_fffffffffffffc70);
  if ((*(byte *)(in_RDI + 0x69) & 1) != 0) {
    anon_unknown_26::applyFilenamesAsTags();
  }
  this_00 = getCurrentMutableContext();
  pCVar5 = Detail::unique_ptr<Catch::Config>::get((unique_ptr<Catch::Config> *)(in_RDI + 0x170));
  Context::setConfig(this_00,&pCVar5->super_IConfig);
  Detail::unique_ptr<Catch::Config>::get((unique_ptr<Catch::Config> *)(in_RDI + 0x170));
  anon_unknown_26::prepareReporters(in_stack_fffffffffffffe38);
  pCVar5 = Detail::unique_ptr<Catch::Config>::operator->
                     ((unique_ptr<Catch::Config> *)(in_RDI + 0x170));
  iVar2 = (*(pCVar5->super_IConfig)._vptr_IConfig[0xd])();
  local_30 = TestSpec::getInvalidSpecs_abi_cxx11_((TestSpec *)CONCAT44(extraout_var,iVar2));
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_fffffffffffffc80);
  if (!bVar1) {
    local_38 = local_30;
    local_40._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffc68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffc68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffc70,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffc68), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_40);
      pIVar6 = Detail::unique_ptr<Catch::IEventListener>::operator->(local_28);
      StringRef::StringRef
                ((StringRef *)in_stack_fffffffffffffc70,(string *)in_stack_fffffffffffffc68);
      (*pIVar6->_vptr_IEventListener[3])(pIVar6,local_60,local_58);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_40);
    }
    local_4 = 1;
    goto LAB_0017f0ca;
  }
  Detail::unique_ptr<Catch::IEventListener>::operator*(local_28);
  Detail::unique_ptr<Catch::Config>::operator*((unique_ptr<Catch::Config> *)(in_RDI + 0x170));
  bVar1 = list((IEventListener *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  if (bVar1) {
    local_4 = 0;
    goto LAB_0017f0ca;
  }
  Detail::unique_ptr<Catch::Config>::get((unique_ptr<Catch::Config> *)(in_RDI + 0x170));
  anon_unknown_26::TestGroup::TestGroup
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  anon_unknown_26::TestGroup::execute(in_stack_fffffffffffffd20);
  bVar1 = anon_unknown_26::TestGroup::hadUnmatchedTestSpecs((TestGroup *)(local_2b0 + 1));
  if (bVar1) {
    pCVar5 = Detail::unique_ptr<Catch::Config>::operator->
                       ((unique_ptr<Catch::Config> *)(in_RDI + 0x170));
    uVar3 = (*(pCVar5->super_IConfig)._vptr_IConfig[7])();
    if ((uVar3 & 1) == 0) goto LAB_0017ef87;
    local_4 = 3;
  }
  else {
LAB_0017ef87:
    uVar7 = Counts::total(local_2b0);
    if (uVar7 == 0) {
      pCVar5 = Detail::unique_ptr<Catch::Config>::operator->
                         ((unique_ptr<Catch::Config> *)(in_RDI + 0x170));
      uVar3 = (*(pCVar5->super_IConfig)._vptr_IConfig[8])();
      if ((uVar3 & 1) == 0) {
        local_4 = 2;
        goto LAB_0017f0bd;
      }
    }
    uVar7 = Counts::total(local_2b0);
    if ((uVar7 != 0) && (uVar7 = Counts::total(local_2b0), uVar7 == local_2b0[0].skipped)) {
      pCVar5 = Detail::unique_ptr<Catch::Config>::operator->
                         ((unique_ptr<Catch::Config> *)(in_RDI + 0x170));
      uVar3 = (*(pCVar5->super_IConfig)._vptr_IConfig[8])();
      if ((uVar3 & 1) == 0) {
        local_4 = 4;
        goto LAB_0017f0bd;
      }
    }
    local_2d4[0] = local_2c8;
    piVar8 = std::min<int>(&(anonymous_namespace)::MaxExitCode,local_2d4);
    local_4 = *piVar8;
  }
LAB_0017f0bd:
  anon_unknown_26::TestGroup::~TestGroup(in_stack_fffffffffffffc70);
LAB_0017f0ca:
  Detail::unique_ptr<Catch::IEventListener>::~unique_ptr
            ((unique_ptr<Catch::IEventListener> *)in_stack_fffffffffffffc70);
  return local_4;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        if ( m_configData.shardIndex >= m_configData.shardCount ) {
            Catch::cerr() << "The shard count (" << m_configData.shardCount
                          << ") must be greater than the shard index ("
                          << m_configData.shardIndex << ")\n"
                          << std::flush;
            return 1;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if (m_configData.filenamesAsTags) {
                applyFilenamesAsTags();
            }

            // Set up global config instance before we start calling into other functions
            getCurrentMutableContext().setConfig(m_config.get());

            // Create reporter(s) so we can route listings through them
            auto reporter = prepareReporters(m_config.get());

            auto const& invalidSpecs = m_config->testSpec().getInvalidSpecs();
            if ( !invalidSpecs.empty() ) {
                for ( auto const& spec : invalidSpecs ) {
                    reporter->reportInvalidTestSpec( spec );
                }
                return 1;
            }


            // Handle list request
            if (list(*reporter, *m_config)) {
                return 0;
            }

            TestGroup tests { CATCH_MOVE(reporter), m_config.get() };
            auto const totals = tests.execute();

            if ( tests.hadUnmatchedTestSpecs()
                && m_config->warnAboutUnmatchedTestSpecs() ) {
                return 3;
            }

            if ( totals.testCases.total() == 0
                && !m_config->zeroTestsCountAsSuccess() ) {
                return 2;
            }

            if ( totals.testCases.total() > 0 &&
                 totals.testCases.total() == totals.testCases.skipped
                && !m_config->zeroTestsCountAsSuccess() ) {
                return 4;
            }

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, static_cast<int>(totals.assertions.failed));
        }